

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[47],char_const*,char[15],char[16],unsigned_int,char[90],std::__cxx11::string,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [47],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [16],uint *Args_4,char (*Args_5) [90],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_6,
          char (*Args_7) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[47],char_const*,char[15],char[16],unsigned_int,char[90],std::__cxx11::string,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [47])this,(char **)Args,(char (*) [15])Args_1,(char (*) [16])Args_2,
             (uint *)Args_3,(char (*) [90])Args_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_5,
             (char (*) [2])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}